

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O2

Union * __thiscall
FactorisedJoin::leapfroggingJoin
          (FactorisedJoin *this,DTreeNode *node,int *lower,int *upper,uint partition)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  int *left;
  int *upper_00;
  value_type *ppUVar6;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar7;
  pointer ppVar8;
  pointer ppVar9;
  pointer ppVar10;
  Database pTVar11;
  DTreeNode *node_00;
  pointer ppUVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  int iVar16;
  iterator iVar17;
  PartitionAttributes *pPVar18;
  Union *pUVar19;
  ulong uVar20;
  double *pdVar21;
  Union **ppUVar22;
  __hashtable *__h;
  FactorisedJoin *this_00;
  long lVar23;
  long lVar24;
  pointer __src;
  ulong uVar25;
  vector<node::Union_*,_std::allocator<node::Union_*>_> *pvVar26;
  DTreeNode **ppDVar27;
  value_type *__x;
  DTreeNode *node_01;
  int i_1;
  uint uVar28;
  ulong uVar29;
  double *pdVar30;
  Union *local_f0;
  int rel;
  allocator_type local_e1;
  DTreeNode *local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  vector<node::Union_*,_std::allocator<node::Union_*>_> *local_c0;
  double val;
  FactorisedJoin *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  ulong local_a0;
  ulong local_98;
  vector<double,_std::allocator<double>_> *local_90;
  double *local_88;
  int *local_80;
  vector<double,_std::allocator<double>_> keyVals;
  int *l;
  DTreeNode **local_50;
  vector<double,_std::allocator<double>_> keyVals_1;
  
  local_d8 = (long)node->_id;
  bVar2 = node->_caching;
  pPVar18 = this->_partitionFields;
  local_98 = CONCAT44(local_98._4_4_,partition);
  pvVar26 = (vector<node::Union_*,_std::allocator<node::Union_*>_> *)((ulong)partition * 0x40);
  pdVar30 = pPVar18[partition].varMap;
  local_c8 = (ulong)(uint)node->_numOfChildren;
  local_e0 = node;
  if (bVar2 == true) {
    keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(double)node->_id;
    local_c0 = pvVar26;
    std::vector<double,_std::allocator<double>_>::vector
              (&keyVals,((long)(node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2) + 1,
               (value_type_conflict3 *)&keyVals_1,(allocator_type *)&l);
    piVar4 = (node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (node->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar23 = 0; (long)piVar5 - (long)piVar4 >> 2 != lVar23; lVar23 = lVar23 + 1) {
      keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar23] = pdVar30[piVar4[lVar23]];
    }
    std::mutex::lock(&this->_cacheMutex);
    iVar17 = std::
             _Hashtable<std::vector<double,_std::allocator<double>_>,_std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_std::allocator<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<double,_std::allocator<double>_>_>,_std::hash<std::vector<double,_std::allocator<double>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->_caches)._M_h,&keyVals);
    if (iVar17.
        super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_f0 = *(Union **)
                  ((long)iVar17.
                         super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
                         ._M_cur + 0x20);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_cacheMutex);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&keyVals.super__Vector_base<double,_std::allocator<double>_>);
    if (iVar17.
        super__Node_iterator_base<std::pair<const_std::vector<double,_std::allocator<double>_>,_node::Union_*>,_true>
        ._M_cur != (__node_type *)0x0) {
      return local_f0;
    }
    pPVar18 = this->_partitionFields;
    pvVar26 = local_c0;
  }
  lVar23 = local_d8;
  left = *(int **)(*(long *)((long)&pPVar18->LOWERBOUND + (long)pvVar26) + local_d8 * 8);
  local_b0 = this;
  l = left;
  memcpy(left,lower,dfdb::params::NUM_OF_TABLES << 2);
  this_00 = local_b0;
  upper_00 = *(int **)(*(long *)((long)&local_b0->_partitionFields->UPPERBOUND + (long)pvVar26) +
                      lVar23 * 8);
  memcpy(upper_00,upper,dfdb::params::NUM_OF_TABLES << 2);
  lVar14 = local_d8;
  node_01 = local_e0;
  pPVar18 = this_00->_partitionFields;
  lVar23 = *(long *)((long)&pPVar18->values + (long)pvVar26);
  lVar24 = local_d8 * 0x18;
  local_a8 = (vector<double,_std::allocator<double>_> *)(lVar23 + lVar24);
  if (*(pointer *)(lVar23 + 8 + lVar24) != *(pointer *)(lVar23 + lVar24)) {
    (local_a8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)(lVar23 + lVar24);
  }
  lVar23 = *(long *)((long)&pPVar18->localCount + (long)pvVar26);
  local_90 = (vector<double,_std::allocator<double>_> *)(lVar23 + lVar24);
  if (*(pointer *)(lVar23 + 8 + lVar24) != *(pointer *)(lVar23 + lVar24)) {
    (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)(lVar23 + lVar24);
  }
  lVar23 = *(long *)((long)&pPVar18->pointers + (long)pvVar26);
  local_c0 = (vector<node::Union_*,_std::allocator<node::Union_*>_> *)(lVar23 + lVar24);
  if (*(pointer *)(lVar23 + 8 + lVar24) != *(pointer *)(lVar23 + lVar24)) {
    (local_c0->super__Vector_base<node::Union_*,_std::allocator<node::Union_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)(lVar23 + lVar24);
  }
  ppUVar6 = *(value_type **)
             (*(long *)((long)&pPVar18->localPointerPlaceholder + (long)pvVar26) + local_d8 * 8);
  local_80 = *(int **)(*(long *)((long)&pPVar18->ordering + (long)pvVar26) + local_d8 * 8);
  getRelationOrdering(this_00,left,local_e0,local_80);
  rel = 0;
  local_a0 = (ulong)((long)this_00->_ids[lVar14].
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)this_00->_ids[lVar14].
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
  local_50 = &node_01->_firstChild;
  local_d0 = 0;
  local_88 = pdVar30;
  while (bVar15 = seekValue(this_00,node_01,&rel,local_80,(int)local_a0,&l,upper,&val), !bVar15) {
    pvVar7 = this_00->_ids;
    ppVar8 = pvVar7[lVar14].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ppVar9 = pvVar7[lVar14].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar23 = 0; lVar23 != (long)ppVar8 - (long)ppVar9 >> 3; lVar23 = lVar23 + 1) {
      ppVar10 = pvVar7[node_01->_id].
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar16 = ppVar10[lVar23].first;
      iVar3 = ppVar10[lVar23].second;
      lVar24 = (long)left[iVar16];
      pTVar11 = this_00->_data;
      while (upper_00[iVar16] = (int)lVar24, lVar24 < upper[iVar16]) {
        lVar13 = lVar24 + 1;
        lVar24 = lVar24 + 1;
        dVar1 = pTVar11[iVar16].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13][iVar3];
        if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) break;
      }
    }
    if ((int)local_c8 < 1) {
      std::vector<double,_std::allocator<double>_>::push_back(local_a8,&val);
      local_d0 = (ulong)((int)local_d0 + 1);
    }
    else {
      pdVar30[local_d8] = val;
      ppDVar27 = local_50;
      for (uVar29 = 0; local_c8 != uVar29; uVar29 = uVar29 + 1) {
        node_00 = *ppDVar27;
        pUVar19 = leapfroggingJoin(this_00,node_00,left,upper_00,(uint)local_98);
        ppUVar6[uVar29] = pUVar19;
        node_01 = local_e0;
        pdVar30 = local_88;
        if (pUVar19 == (Union *)0x0) goto LAB_0012d89a;
        ppDVar27 = &node_00->_next;
      }
      std::vector<double,_std::allocator<double>_>::push_back(local_a8,&val);
      uVar28 = 1;
      uVar29 = local_c8;
      __x = ppUVar6;
      while (bVar15 = uVar29 != 0, uVar29 = uVar29 - 1, bVar15) {
        std::vector<node::Union_*,_std::allocator<node::Union_*>_>::push_back(local_c0,__x);
        uVar28 = uVar28 * (*__x)->count;
        __x = __x + 1;
      }
      local_d0 = (ulong)((int)local_d0 + uVar28);
      keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(double)uVar28;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (local_90,(double *)&keyVals);
      this_00 = local_b0;
      node_01 = local_e0;
      pdVar30 = local_88;
    }
LAB_0012d89a:
    ppVar8 = this_00->_ids[lVar14].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar9 = this_00->_ids[lVar14].
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar23 = 0; (long)ppVar9 - (long)ppVar8 >> 3 != lVar23; lVar23 = lVar23 + 1) {
      left[ppVar8[lVar23].first] = upper_00[ppVar8[lVar23].first];
    }
    iVar16 = ppVar8[local_80[rel]].first;
    iVar3 = left[iVar16];
    left[iVar16] = iVar3 + 1;
    if (upper[iVar16] <= iVar3) break;
    rel = (rel + 1) % (int)local_a0;
  }
  __src = (local_a8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start;
  uVar29 = (long)(local_a8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)__src;
  iVar16 = (int)(uVar29 >> 3);
  if (iVar16 == 0) {
    pUVar19 = (Union *)0x0;
  }
  else {
    pUVar19 = (Union *)operator_new(0x38);
    pUVar19->numberOfValues = 0;
    pUVar19->cacheIndex = 0;
    *(undefined2 *)&pUVar19->field_0x1a = 0;
    pUVar19->count = 0;
    pUVar19->values = (double *)0x0;
    pUVar19->children = (Union **)0x0;
    *(undefined8 *)&pUVar19->multiplicity = 0;
    pUVar19->sums = (double *)0x0;
    pUVar19->sumIndexes = (int *)0x0;
    uVar20 = (ulong)iVar16;
    pUVar19->numberOfValues = uVar20;
    this_00->numberOfValues = this_00->numberOfValues + uVar20;
    uVar29 = (long)(uVar29 * 0x20000000) >> 0x1d;
    if (local_c8 == 0) {
      pdVar21 = (double *)operator_new__(-(ulong)(uVar20 >> 0x3d != 0) | uVar29);
      pUVar19->values = pdVar21;
    }
    else {
      uVar25 = (long)(iVar16 * 2) << 3;
      if (iVar16 < 0) {
        uVar25 = 0xffffffffffffffff;
      }
      local_98 = uVar20;
      pdVar21 = (double *)operator_new__(uVar25);
      pUVar19->values = pdVar21;
      memcpy(pdVar21,__src,uVar29);
      pdVar21 = pdVar21 + local_98;
      __src = (local_90->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
      node_01 = local_e0;
    }
    memcpy(pdVar21,__src,uVar29);
    iVar16 = (int)local_c8 * iVar16;
    uVar29 = (long)iVar16 * 8;
    if (iVar16 < 0) {
      uVar29 = 0xffffffffffffffff;
    }
    ppUVar22 = (Union **)operator_new__(uVar29);
    pUVar19->children = ppUVar22;
    for (uVar29 = 0;
        ppUVar12 = (local_c0->super__Vector_base<node::Union_*,_std::allocator<node::Union_*>_>).
                   _M_impl.super__Vector_impl_data._M_start,
        uVar29 < (ulong)((long)(local_c0->
                               super__Vector_base<node::Union_*,_std::allocator<node::Union_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppUVar12 >> 3);
        uVar29 = uVar29 + 1) {
      ppUVar22[uVar29] = ppUVar12[uVar29];
    }
    pUVar19->count = (uint)local_d0;
    if (bVar2 != false) {
      keyVals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(double)(int)local_d8;
      std::vector<double,_std::allocator<double>_>::vector
                (&keyVals_1,
                 ((long)(node_01->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(node_01->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) + 1,(value_type_conflict3 *)&keyVals,
                 &local_e1);
      piVar4 = (node_01->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (node_01->_key).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (lVar23 = 0; (long)piVar5 - (long)piVar4 >> 2 != lVar23; lVar23 = lVar23 + 1) {
        keyVals_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar23] = pdVar30[piVar4[lVar23]];
      }
      std::mutex::lock(&this_00->_cacheMutex);
      uVar28 = this_00->numberOfCachedValues;
      pUVar19->cacheIndex = (unsigned_short)uVar28;
      this_00->numberOfCachedValues = uVar28 + 1;
      std::vector<double,_std::allocator<double>_>::vector(&keyVals,&keyVals_1);
      std::
      _Hashtable<std::vector<double,std::allocator<double>>,std::pair<std::vector<double,std::allocator<double>>const,node::Union*>,std::allocator<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>,std::__detail::_Select1st,std::equal_to<std::vector<double,std::allocator<double>>>,std::hash<std::vector<double,std::allocator<double>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>
                ((_Hashtable<std::vector<double,std::allocator<double>>,std::pair<std::vector<double,std::allocator<double>>const,node::Union*>,std::allocator<std::pair<std::vector<double,std::allocator<double>>const,node::Union*>>,std::__detail::_Select1st,std::equal_to<std::vector<double,std::allocator<double>>>,std::hash<std::vector<double,std::allocator<double>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this_00->_caches);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&keyVals.super__Vector_base<double,_std::allocator<double>_>);
      pthread_mutex_unlock((pthread_mutex_t *)&this_00->_cacheMutex);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&keyVals_1.super__Vector_base<double,_std::allocator<double>_>);
    }
  }
  return pUVar19;
}

Assistant:

Union* FactorisedJoin::leapfroggingJoin(
    DTreeNode* node, int* lower, int* upper, unsigned int partition)
{
    int_fast16_t nodeID = node->_id;
    bool caching = node->_caching;
    double* varMap = _partitionFields[partition].varMap;
    int childrenCount = node->_numOfChildren;

    /* If this node allows for caching we check if the aggregate array has been
     * cached already. */
    if (caching)
    {
        /* 
         * We initialise the elements in the vector to nodeID instead of 
         * default-initialising them. The last element will not be overwritten. 
         */
        vector<double> keyVals(node->_key.size() + 1, nodeID);
        for (size_t i = 0; i < node->_key.size(); ++i)
            keyVals[i] = varMap[node->_key[i]];

        lock_guard<mutex> lock(_cacheMutex);
		
        auto it = _caches.find(keyVals);
        if (it != _caches.end())
        {
            return it->second;			// Return pointer to cached union node.
        }
    }

    /* lower range pointer for each relation. */
    int* l = _partitionFields[partition].LOWERBOUND[nodeID];
    memcpy(l, lower, sizeof(int) * NUM_OF_TABLES);

    /* upper range pointer for each relation. */
    int* u = _partitionFields[partition].UPPERBOUND[nodeID];
    memcpy(u, upper, sizeof(int) * NUM_OF_TABLES);

    vector<double>& unionValues = _partitionFields[partition].values[nodeID];
    unionValues.clear();

    vector<double>& unionCounts = _partitionFields[partition].localCount[nodeID];
    unionCounts.clear();

    vector<Union*>& unionPointers = _partitionFields[partition].pointers[nodeID];
    unionPointers.clear();

    Union** localPointers = _partitionFields[partition].localPointerPlaceholder[nodeID];

    int* ordering = _partitionFields[partition].ordering[nodeID];

    /* Provides order of Relations from min -> max. */
    getRelationOrdering(l, node, ordering);

    /* Value that satisfies the join query - set in seekValue. */
    double val;
    unsigned int count = 0; 

    /* Indexes used by the join algorithm. */
    int i, j, rel = 0, numOfRel = _ids[nodeID].size();
    bool atEnd = false;
    while (!atEnd)
    {
        /* seek the value that satisfies the join query */
        atEnd = seekValue(node, rel, ordering, numOfRel, l, upper, val);

        if (atEnd)
            break;

        /* Get range of tuples with value equal to val. */
        for (size_t k = 0; k < _ids[nodeID].size(); ++k)
        {
            i = _ids[node->_id][k].first;
            j = _ids[node->_id][k].second;
            u[i] = l[i];

            // TODO: This could be optimized and perhaps added to seek value
            while (u[i] < upper[i] && _data[i][u[i] + 1][j] == val)
            {
                ++u[i];
            }
        }

        /*
         * Below the aggregates are updated based on the value that
         * satisfied the join query.
         */
        if (childrenCount > 0)
        {
            bool childEmpty = false;

            /* 
             * Update the varMap which keeps track of the values that satisfy the 
             * join query above this node 
             */
            varMap[nodeID] = val;

            DTreeNode* child = node->_firstChild;
            for (int i = 0; i < childrenCount; ++i)
            {
                /* Call join algorithm for each child */
                localPointers[i] = leapfroggingJoin(child, l, u, partition);

                /*
                 * If the first aggregate for child is zero then count = 0
                 * and the join query is not satisfied for this value. 
                 */ 
                if (localPointers[i] == nullptr)
                {
                    childEmpty = true;
                    break;
                }

                child = child->_next;
            }

            /* if no child is empty we update the aggregates */
            if (!childEmpty)
            {
                /* Push back the value from this node */ 
                unionValues.push_back(val);

                unsigned int localCount = 1;
                for (int i = 0; i < childrenCount; ++i)
                {
                    unionPointers.push_back(localPointers[i]);
                    localCount *= localPointers[i] -> count; 
                }

                count += localCount;
                unionCounts.push_back(localCount);
            }
        }
        /* Case for leaf nodes */
        else
        {
            /* Push back the value from this node */ 
            unionValues.push_back(val);
            ++count;
        }

        for (size_t k = 0; k < _ids[nodeID].size(); ++k)
        {
            i = _ids[nodeID][k].first;
            l[i] = u[i];
        }

        i = _ids[nodeID][ordering[rel]].first;
        l[i] += 1;

        if (l[i] > upper[i])
        {
            atEnd = true;
            break;
        }
        else
        {
            rel = (rel + 1) % numOfRel;
        }
    }

    int numOfUnionValues = unionValues.size(); 
    /*
     * If unionValues.size() == 0 it means that no value for this node
     * has satisfied the join query, so the union is empty.
     */
    if (numOfUnionValues == 0) 
    {
        // delete unionNode; 
        return nullptr;
    }

    /* If there are values in the union we construct the union */
    Union* unionNode = new Union();
    unionNode->numberOfValues = numOfUnionValues;

    numberOfValues += numOfUnionValues; 

    if (childrenCount == 0)
    {
        /* Initialise values array */
        unionNode->values = new double[numOfUnionValues];
		
        /* Copy values into array */
        memcpy(unionNode->values, &unionValues[0],
               numOfUnionValues*sizeof(double));
    }
    else
    {
        /* Initialise values array */
        unionNode->values = new double[numOfUnionValues * 2];
		
        /* Copy values into array */
        memcpy(unionNode->values, &unionValues[0],
               numOfUnionValues*sizeof(double));

        /* Copy values into array */
        memcpy(unionNode->values+numOfUnionValues, &unionCounts[0],
               numOfUnionValues*sizeof(double));
    }

    assert( (size_t) numOfUnionValues * childrenCount == unionPointers.size());

    /* Initialise pointer array */
    unionNode->children = new Union*[numOfUnionValues * childrenCount];

    /* Copy pointer into array */
    for (size_t pointer = 0; pointer < unionPointers.size(); ++pointer)
        unionNode->children[pointer] = unionPointers[pointer];

    unionNode -> count = count; 
	
    /* If we get here and caching is allowed it means that we need to add
     * aggregates to cache. */
    if (caching)
    {
        /*
         * We initialise the elements in the vector to nodeID instead of
         * default-initialising them.  The last element will not be overwritten.
         */
        vector<double> keyVals(node->_key.size() + 1, nodeID);
        for (size_t i = 0; i < node->_key.size(); ++i)
            keyVals[i] = varMap[node->_key[i]];

        /* Lock the _caches map so we can savely insert our newly cached values */
        lock_guard<mutex> lock(_cacheMutex);
        unionNode->cacheIndex = numberOfCachedValues;
        ++numberOfCachedValues;
        _caches.insert({ keyVals, unionNode });
    }

    return unionNode; 
}